

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void flush_to(PtrList *b,void **buffer,int *nbuf)

{
  int iVar1;
  int nr;
  int *nbuf_local;
  void **buffer_local;
  PtrList *b_local;
  
  iVar1 = (int)(short)(char)*(undefined2 *)b;
  if (iVar1 <= *nbuf) {
    memcpy(b->list_,buffer,(long)iVar1 << 3);
    *nbuf = *nbuf - iVar1;
    memmove(buffer,buffer + iVar1,(long)*nbuf << 3);
    return;
  }
  __assert_fail("*nbuf >= nr",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x1cc,"void flush_to(PtrList *, void **, int *)");
}

Assistant:

static void flush_to(PtrList *b, void **buffer, int *nbuf)
{
	int nr = b->nr_;
	assert(*nbuf >= nr);
	memcpy(b->list_, buffer, nr * sizeof(void *));
	*nbuf = *nbuf - nr;
	memmove(buffer, buffer + nr, *nbuf * sizeof(void *));
}